

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceQueryBufferLimitCase::iterate
          (ResourceQueryBufferLimitCase *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  int iVar1;
  Context *this_03;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ProgramSources *sources;
  long lVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  char *in_RCX;
  char *description;
  GLsizei *pGVar9;
  bool bVar10;
  GLsizei written;
  ResourceQueryBufferLimitCase *local_300;
  int *local_2f8;
  int local_2ec;
  long local_2e8;
  ScopedLogSection section_1;
  int params [4];
  ScopedLogSection section;
  undefined1 local_280 [176];
  pointer local_1d0;
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined1 uStack_1c0;
  undefined8 uStack_1bf;
  ShaderProgram program;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2e8 = CONCAT44(extraout_var,iVar4);
  this_03 = (this->super_TestCase).m_context;
  renderCtx = this_03->m_renderCtx;
  local_300 = this;
  memset(local_280,0,0xac);
  local_1d0 = (pointer)0x0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)this_03,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniform;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniform;\n}\n"
             ,in_RCX);
  glu::ComputeSource::ComputeSource((ComputeSource *)params,(string *)&section);
  sources = glu::ProgramSources::operator<<((ProgramSources *)local_280,(ShaderSource *)params);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(params + 2));
  std::__cxx11::string::~string((string *)&section);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  tcu::TestContext::setTestResult
            ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
             ,"Pass");
  pTVar2 = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"Program",(allocator<char> *)&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)params,"Program",(allocator<char> *)&written);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_280,(string *)params);
  std::__cxx11::string::~string((string *)params);
  std::__cxx11::string::~string((string *)local_280);
  glu::operator<<(((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"could not build program",(allocator<char> *)params);
    tcu::TestError::TestError(pTVar8,(string *)local_280);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  local_2ec = (**(code **)(local_2e8 + 0x9a8))(program.m_program.m_program,0x92e1,"u_uniform");
  dVar5 = (**(code **)(local_2e8 + 0x800))();
  glu::checkError(dVar5,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x644);
  if (local_2ec == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"Uniform u_uniform resource index was GL_INVALID_INDEX",
               (allocator<char> *)params);
    tcu::TestError::TestError(pTVar8,(string *)local_280);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar6 = 6;
  local_2f8 = &iterate::querySizes[0].numProps;
  do {
    bVar10 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar10) {
      glu::ShaderProgram::~ShaderProgram(&program);
      return STOP;
    }
    pTVar2 = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"QueryToLarger",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)params,((anon_struct_24_4_620351ce *)(local_2f8 + -2))->description,
               (allocator<char> *)&written);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar2,(string *)local_280,(string *)params);
    std::__cxx11::string::~string((string *)params);
    std::__cxx11::string::~string((string *)local_280);
    section.m_log = (TestLog *)0x930e0000930e;
    iVar4 = *local_2f8;
    iVar1 = local_2f8[1];
    iVar3 = iVar4;
    if (iVar1 < iVar4) {
      iVar3 = iVar1;
    }
    written = -1;
    params[0] = 0xff;
    params[1] = 0xff;
    params[2] = 0xff;
    params[3] = 0xff;
    local_280._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::operator<<((ostream *)(local_280 + 8),"Querying ");
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_280,local_2f8);
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " uniform prop(s) to a buffer with size ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_2f8 + 1);
    this_00 = &pMVar7->m_str;
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    ". Expecting query to return ");
    std::ostream::operator<<(this_00,iVar3);
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," prop(s)");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
    bVar10 = *(bool *)(local_2f8 + 2);
    pGVar9 = (GLsizei *)0x0;
    if (bVar10 != false) {
      pGVar9 = &written;
    }
    (**(code **)(local_2e8 + 0x9c8))
              (program.m_program.m_program,0x92e1,local_2ec,iVar4,&section,iVar1,pGVar9);
    this_01 = (ostringstream *)(local_280 + 8);
    this_02 = (ostringstream *)(local_280 + 8);
    dVar5 = (**(code **)(local_2e8 + 0x800))();
    glu::checkError(dVar5,"query program resources",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x66d);
    if ((bVar10 == false) || (written == iVar3)) {
      if (params[iVar3] != 0xff) {
        local_280._0_8_ =
             ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"Error, guard at index ");
        std::ostream::operator<<(this_01,iVar3);
        std::operator<<((ostream *)this_01," was modified. Was 255 before call, got dec=");
        pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_280,params + iVar3);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        description = "Wrote over buffer size";
        goto LAB_012e74a1;
      }
    }
    else {
      local_280._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream(this_02);
      std::operator<<((ostream *)this_02,"Error, expected write length of ");
      std::ostream::operator<<(this_02,iVar3);
      std::operator<<((ostream *)this_02,", got ");
      std::ostream::operator<<(this_02,written);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_02);
      description = "Unexpected write lenght";
LAB_012e74a1:
      tcu::TestContext::setTestResult
                ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,description);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    local_2f8 = local_2f8 + 6;
  } while( true );
}

Assistant:

ResourceQueryBufferLimitCase::IterateResult ResourceQueryBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniform;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniform;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniform");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniform resource index was GL_INVALID_INDEX");

	// Query uniform properties

	{
		static const struct
		{
			const char*	description;
			int			numProps;
			int			bufferSize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to a larger buffer",							2, 3, true	},
			{ "Query to too small a buffer",						3, 2, true	},
			{ "Query to zero sized buffer",							3, 0, true	},
			{ "Query to a larger buffer, null length argument",		2, 3, false	},
			{ "Query to too small a buffer, null length argument",	3, 2, false	},
			{ "Query to zero sized buffer, null length argument",	3, 0, false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection		section				(m_testCtx.getLog(), "QueryToLarger", querySizes[ndx].description);
			const glw::GLenum				props[]				= { GL_LOCATION, GL_LOCATION, GL_LOCATION };
			const int						expectedWriteLen	= de::min(querySizes[ndx].bufferSize, querySizes[ndx].numProps);
			int								params[]			= { 255, 255, 255, 255 };
			glw::GLsizei					written				= -1;

			DE_ASSERT(querySizes[ndx].numProps <= DE_LENGTH_OF_ARRAY(props));
			DE_ASSERT(querySizes[ndx].bufferSize < DE_LENGTH_OF_ARRAY(params)); // leave at least one element for overflow detection

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Querying " << querySizes[ndx].numProps << " uniform prop(s) to a buffer with size " << querySizes[ndx].bufferSize << ". Expecting query to return " << expectedWriteLen << " prop(s)"
				<< tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].numProps, props, querySizes[ndx].bufferSize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), params);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query program resources");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (params[expectedWriteLen] != 255)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen) << " was modified. Was 255 before call, got dec=" << params[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
		}
	}

	return STOP;
}